

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_remotes.cpp
# Opt level: O2

Remotes * Omega_h::identity_remotes(Remotes *__return_storage_ptr__,CommPtr *comm,LO n)

{
  I32 value;
  allocator local_82;
  allocator local_81;
  Write<int> local_80;
  Write<int> local_70;
  string local_60;
  string local_40;
  
  value = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__cxx11::string::string((string *)&local_40,"",&local_81);
  Read<int>::Read((Read<int> *)&local_70,n,value,&local_40);
  std::__cxx11::string::string((string *)&local_60,"",&local_82);
  Read<int>::Read((Read<int> *)&local_80,n,0,1,&local_60);
  Remotes::Remotes(__return_storage_ptr__,(Read<int> *)&local_70,(LOs *)&local_80);
  Write<int>::~Write(&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  Write<int>::~Write(&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Remotes identity_remotes(CommPtr comm, LO n) {
  return Remotes(Read<I32>(n, comm->rank()), LOs(n, 0, 1));
}